

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteJson(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName_00;
  bool bVar1;
  int iVar2;
  Abc_Frame_t *pAVar3;
  Abc_Nam_t *pAVar4;
  Vec_Wec_t *pVVar5;
  char *pFileName;
  int fExtract;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ch"), iVar2 != -1) {
    if (iVar2 != 99) goto LAB_003a3b2a;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  pAVar3 = Abc_FrameReadGlobalFrame();
  pAVar4 = Abc_FrameReadJsonStrs(pAVar3);
  if (pAVar4 == (Abc_Nam_t *)0x0) {
    fprintf((FILE *)pAbc->Out,"No JSON info is available.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind + 1) {
    pFileName_00 = argv[globalUtilOptind];
    if (bVar1) {
      pAVar3 = Abc_FrameReadGlobalFrame();
      pAVar4 = Abc_FrameReadJsonStrs(pAVar3);
      pAVar3 = Abc_FrameReadGlobalFrame();
      pVVar5 = Abc_FrameReadJsonObjs(pAVar3);
      Json_Extract(pFileName_00,pAVar4,pVVar5);
    }
    else {
      pAVar3 = Abc_FrameReadGlobalFrame();
      pAVar4 = Abc_FrameReadJsonStrs(pAVar3);
      pAVar3 = Abc_FrameReadGlobalFrame();
      pVVar5 = Abc_FrameReadJsonObjs(pAVar3);
      Json_Write(pFileName_00,pAVar4,pVVar5);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_003a3b2a:
    fprintf((FILE *)pAbc->Err,"usage: write_json [-ch] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         write the network in JSON format\n");
    fprintf((FILE *)pAbc->Err,"\t-c     : output extracted version\n");
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help message\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write (extension .json)\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteJson( Abc_Frame_t * pAbc, int argc, char **argv )
{
    extern void Json_Write( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs );
    extern void Json_Extract( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs );
    int c, fExtract = 0;
    char * pFileName;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'c':
                fExtract ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadJsonStrs(Abc_FrameReadGlobalFrame()) == NULL )
    {
        fprintf( pAbc->Out, "No JSON info is available.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    pFileName = argv[globalUtilOptind];
    if ( fExtract )
        Json_Extract( pFileName, Abc_FrameReadJsonStrs(Abc_FrameReadGlobalFrame()), Abc_FrameReadJsonObjs(Abc_FrameReadGlobalFrame()) );
    else
        Json_Write( pFileName, Abc_FrameReadJsonStrs(Abc_FrameReadGlobalFrame()), Abc_FrameReadJsonObjs(Abc_FrameReadGlobalFrame()) );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_json [-ch] <file>\n" );
    fprintf( pAbc->Err, "\t         write the network in JSON format\n" );
    fprintf( pAbc->Err, "\t-c     : output extracted version\n" );
    fprintf( pAbc->Err, "\t-h     : print the help message\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .json)\n" );
    return 1;
}